

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFilterDup.cpp
# Opt level: O1

bool __thiscall liblogger::LogFilterDup::Filter(LogFilterDup *this,LogType Type,string *str)

{
  LogType Type_00;
  size_t __n;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  if (this->m_busy == false) {
    this->m_busy = true;
    if (((this->m_lasttype == Type) &&
        (__n = str->_M_string_length, __n == (this->m_last)._M_string_length)) &&
       ((__n == 0 ||
        (iVar2 = bcmp((str->_M_dataplus)._M_p,(this->m_last)._M_dataplus._M_p,__n), iVar2 == 0)))) {
      this->m_matched = this->m_matched + 1;
      bVar1 = true;
    }
    else {
      if (this->m_matched != 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"Last message repeated ",0x16);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,this->m_matched);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," times",6);
        Type_00 = this->m_lasttype;
        std::__cxx11::stringbuf::str();
        LogManager::Send(Type_00,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1a8);
        std::ios_base::~ios_base(local_128);
      }
      this->m_matched = 0;
      std::__cxx11::string::_M_assign((string *)&this->m_last);
      this->m_lasttype = Type;
      bVar1 = false;
    }
    this->m_busy = false;
    return bVar1;
  }
  return false;
}

Assistant:

bool LogFilterDup::Filter(const LogType Type, const std::string &str)
{
	if (m_busy)
		return false; //Being reentered
	m_busy = true;
	try
	{
		if (Type == m_lasttype && str == m_last)
		{
			m_matched++;
			m_busy = false;
			return true;
		}
	
		if (m_matched)
		{
			std::stringstream ss;
			ss << "Last message repeated " << m_matched << " times";
			LogManager::Send(m_lasttype, ss.str());
		}
		m_matched = 0;
		m_last = str;
		m_lasttype = Type;
		m_busy = false;
		return false;
	}
	catch(std::exception &ex)
	{
		m_busy = false;
		throw(ex);
	}
}